

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_test.c
# Opt level: O0

bool_t ecpTest(void)

{
  bool_t bVar1;
  size_t sVar2;
  word *a;
  word *c;
  void *stack_00;
  ec_o *ec_00;
  word *a_00;
  ec_o *ec_01;
  word d_1;
  word *pts_1;
  word d;
  word *pts;
  ec_o *ec;
  qr_o *f;
  octet t [160];
  octet stack [2048];
  octet state [2048];
  size_t f_deep;
  size_t ec_keep;
  size_t f_keep;
  size_t n;
  char *in_stack_ffffffffffffeeb8;
  char *src;
  ec_o *in_stack_ffffffffffffeec0;
  qr_o *in_stack_ffffffffffffeec8;
  word *a_01;
  ec_o *in_stack_ffffffffffffeed0;
  ec_o *in_stack_ffffffffffffeed8;
  ec_o *in_stack_ffffffffffffeee0;
  word *b;
  void *in_stack_ffffffffffffeef0;
  ec_o *in_stack_ffffffffffffeef8;
  size_t in_stack_ffffffffffffef08;
  word *in_stack_ffffffffffffef10;
  word *d_00;
  ec_o *ec_02;
  size_t in_stack_ffffffffffffef20;
  word *a_02;
  word *pwVar3;
  octet *poVar4;
  char in_stack_ffffffffffffef38;
  undefined7 in_stack_ffffffffffffef39;
  qr_o *in_stack_ffffffffffffef40;
  ec_o *in_stack_ffffffffffffef48;
  char local_1028 [2048];
  word local_828 [256];
  size_t local_28;
  size_t local_20;
  size_t local_18;
  undefined8 local_10;
  
  local_10 = 4;
  local_18 = gfpCreate_keep(0x11a8dd);
  local_20 = ecpCreateJ_keep(4);
  local_28 = gfpCreate_deep(0x11a901);
  if ((local_18 + local_20 < 0x801) && (local_28 < 0x801)) {
    hexToRev(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
    poVar4 = (octet *)((long)local_828 + local_20);
    bVar1 = gfpCreate(in_stack_ffffffffffffeec8,(octet *)in_stack_ffffffffffffeec0,
                      (size_t)in_stack_ffffffffffffeeb8,(void *)0x11a98a);
    if (bVar1 != 0) {
      hexToRev(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
      hexToRev(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
      pwVar3 = local_828;
      sVar2 = ecpCreateJ_deep((size_t)pwVar3,in_stack_ffffffffffffef20);
      if ((sVar2 < 0x801) &&
         (bVar1 = ecpCreateJ(in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                             (octet *)CONCAT71(in_stack_ffffffffffffef39,in_stack_ffffffffffffef38),
                             poVar4,pwVar3), bVar1 != 0)) {
        hexToRev(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
        hexToRev(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
        hexToRev(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
        sVar2 = ecCreateGroup_deep(local_28);
        if (sVar2 < 0x801) {
          src = local_1028;
          bVar1 = ecCreateGroup(in_stack_ffffffffffffeed8,(octet *)in_stack_ffffffffffffeed0,
                                (octet *)in_stack_ffffffffffffeec8,
                                (octet *)in_stack_ffffffffffffeec0,(size_t)src,0,
                                in_stack_ffffffffffffeef0);
          if (bVar1 != 0) {
            objAppend(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
                      (size_t)in_stack_ffffffffffffeec0);
            sVar2 = ecpIsValid_deep((size_t)in_stack_ffffffffffffeed0,
                                    (size_t)in_stack_ffffffffffffeec8);
            if ((0x800 < sVar2) ||
               (bVar1 = ecpIsValid(in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0), bVar1 == 0)
               ) {
              return 0;
            }
            sVar2 = ecpSeemsValidGroup_deep
                              ((size_t)in_stack_ffffffffffffeed0,(size_t)in_stack_ffffffffffffeec8);
            if ((0x800 < sVar2) ||
               (bVar1 = ecpSeemsValidGroup(in_stack_ffffffffffffeef8,in_stack_ffffffffffffeef0),
               bVar1 == 0)) {
              return 0;
            }
            sVar2 = ecpIsSafeGroup_deep((size_t)in_stack_ffffffffffffeed0);
            if ((0x800 < sVar2) ||
               (bVar1 = ecpIsSafeGroup(in_stack_ffffffffffffeed8,(size_t)in_stack_ffffffffffffeed0,
                                       in_stack_ffffffffffffeec8), bVar1 == 0)) {
              return 0;
            }
            sVar2 = ecHasOrderA_deep((size_t)in_stack_ffffffffffffeed0,
                                     (size_t)in_stack_ffffffffffffeec8,
                                     (size_t)in_stack_ffffffffffffeec0,(size_t)src);
            if ((0x800 < sVar2) ||
               (bVar1 = ecHasOrderA((word *)in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8,
                                    (word *)in_stack_ffffffffffffeed0,
                                    (size_t)in_stack_ffffffffffffeec8,in_stack_ffffffffffffeec0),
               bVar1 == 0)) {
              return 0;
            }
            if ((pwVar3[9] + 2) * 0x20 < 0xa1) {
              b = (word *)pwVar3[0x15];
              a = (word *)ecpIsOnA_deep(4,local_28);
              c = (word *)ecpAddAA_deep(4,local_28);
              stack_00 = (void *)ecpSubAA_deep(4,local_28);
              sVar2 = ecMulA_deep((size_t)in_stack_ffffffffffffeee0,
                                  (size_t)in_stack_ffffffffffffeed8,
                                  (size_t)in_stack_ffffffffffffeed0,
                                  (size_t)in_stack_ffffffffffffeec8);
              sVar2 = utilMax(5,b,a,c,stack_00,sVar2);
              if (sVar2 < 0x801) {
                a_02 = (word *)&stack0xffffffffffffef38;
                ec_02 = (ec_o *)0x3;
                bVar1 = ecpIsOnA((word *)in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0,
                                 in_stack_ffffffffffffeec8);
                if (((bVar1 == 0) ||
                    (bVar1 = ecpAddAA(c,a,b,in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8),
                    bVar1 == 0)) ||
                   (bVar1 = ecpAddAA(c,a,b,in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8),
                   bVar1 == 0)) {
                  return 0;
                }
                bVar1 = ecpAddAA(c,a,b,in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8);
                if (((bVar1 == 0) ||
                    (bVar1 = ecpAddAA(c,a,b,in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8),
                    bVar1 == 0)) ||
                   ((bVar1 = ecpSubAA(c,a,b,in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8),
                    bVar1 == 0 || (bVar1 = memEq(a_02,a_02 + 8,8), bVar1 == 0)))) {
                  return 0;
                }
                ecpNegA((word *)in_stack_ffffffffffffeed0,(word *)in_stack_ffffffffffffeec8,
                        in_stack_ffffffffffffeec0);
                bVar1 = ecpAddAA(c,a,b,in_stack_ffffffffffffeee0,in_stack_ffffffffffffeed8);
                if (bVar1 != 0) {
                  return 0;
                }
                bVar1 = ecMulA(pwVar3,a_02,ec_02,in_stack_ffffffffffffef10,in_stack_ffffffffffffef08
                               ,stack_00);
                if ((bVar1 == 0) || (bVar1 = memEq(a_02,a_02 + 8,8), bVar1 == 0)) {
                  return 0;
                }
                if (((pwVar3[0xb] == 0) || (pwVar3[0x14] == 0)) || (pwVar3[0xc] == 0)) {
                  return 0;
                }
                (*(code *)pwVar3[0xb])(a_02 + 8,pwVar3[6],pwVar3,local_1028);
                (*(code *)pwVar3[0x14])(a_02 + 8,a_02 + 8,pwVar3,local_1028);
                (*(code *)pwVar3[0xc])(a_02 + 8,a_02 + 8,pwVar3,local_1028);
                bVar1 = memEq(a_02,a_02 + 8,8);
                if (bVar1 == 0) {
                  return 0;
                }
                poVar4 = (octet *)((long)local_828 + local_20);
                memMove(in_stack_ffffffffffffeec0,src,0x11b04a);
                hexToRev(in_stack_ffffffffffffeec0,src);
                in_stack_ffffffffffffef38 = in_stack_ffffffffffffef38 + -1;
                hexToRev(in_stack_ffffffffffffeec0,src);
                pwVar3 = local_828;
                sVar2 = ecpCreateJ_deep((size_t)pwVar3,(size_t)a_02);
                if ((sVar2 < 0x801) &&
                   (bVar1 = ecpCreateJ(in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,
                                       (octet *)CONCAT71(in_stack_ffffffffffffef39,
                                                         in_stack_ffffffffffffef38),poVar4,pwVar3),
                   bVar1 != 0)) {
                  objAppend(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8,
                            (size_t)in_stack_ffffffffffffeec0);
                  hexToRev(in_stack_ffffffffffffeec0,src);
                  hexToRev(in_stack_ffffffffffffeec0,src);
                  u64From((u64 *)in_stack_ffffffffffffeec0,src,0x11b14c);
                  u64From((u64 *)in_stack_ffffffffffffeec0,src,0x11b16f);
                  if ((pwVar3[9] + 2) * 0x20 < 0xa1) {
                    a_01 = (word *)pwVar3[0x15];
                    ec_00 = (ec_o *)ecpIsOnA_deep(4,local_28);
                    a_00 = (word *)ecpAddAA_deep(4,local_28);
                    ec_01 = (ec_o *)ecpSubAA_deep(4,local_28);
                    sVar2 = ecMulA_deep((size_t)ec_01,(size_t)a_00,(size_t)ec_00,(size_t)a_01);
                    sVar2 = utilMax(5,a_01,ec_00,a_00,ec_01,sVar2);
                    if (sVar2 < 0x801) {
                      d_00 = (word *)&stack0xffffffffffffef38;
                      sVar2 = 3;
                      bVar1 = ecpIsOnA(a_00,ec_00,a_01);
                      if (((bVar1 == 0) || (bVar1 = ecpAddAA(c,a,b,ec_01,a_00), bVar1 == 0)) ||
                         (bVar1 = ecpAddAA(c,a,b,ec_01,a_00), bVar1 == 0)) {
                        return 0;
                      }
                      bVar1 = ecpAddAA(c,a,b,ec_01,a_00);
                      if ((((bVar1 == 0) || (bVar1 = ecpAddAA(c,a,b,ec_01,a_00), bVar1 == 0)) ||
                          (bVar1 = ecpSubAA(c,a,b,ec_01,a_00), bVar1 == 0)) ||
                         (bVar1 = memEq(d_00,d_00 + 8,8), bVar1 == 0)) {
                        return 0;
                      }
                      ecpNegA((word *)ec_00,a_01,in_stack_ffffffffffffeec0);
                      bVar1 = ecpAddAA(c,a,b,ec_01,a_00);
                      if (bVar1 != 0) {
                        return 0;
                      }
                      bVar1 = ecMulA(pwVar3,a_02,ec_02,d_00,sVar2,stack_00);
                      if ((bVar1 != 0) && (bVar1 = memEq(d_00,d_00 + 8,8), bVar1 != 0)) {
                        if ((pwVar3[0xb] != 0) && ((pwVar3[0x14] != 0 && (pwVar3[0xc] != 0)))) {
                          (*(code *)pwVar3[0xb])(d_00 + 8,pwVar3[6],pwVar3,local_1028);
                          (*(code *)pwVar3[0x14])(d_00 + 8,d_00 + 8,pwVar3,local_1028);
                          (*(code *)pwVar3[0xc])(d_00 + 8,d_00 + 8,pwVar3,local_1028);
                          bVar1 = memEq(d_00,d_00 + 8,8);
                          if (bVar1 != 0) {
                            return 1;
                          }
                          return 0;
                        }
                        return 0;
                      }
                      return 0;
                    }
                  }
                  return 0;
                }
                return 0;
              }
            }
            return 0;
          }
        }
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

bool_t ecpTest()
{
	// размерности
	const size_t n = W_OF_O(no);
	const size_t f_keep = gfpCreate_keep(no);
	const size_t ec_keep = ecpCreateJ_keep(n);
	const size_t f_deep = gfpCreate_deep(no);
	// состояние и стек
	octet state[2048];
	octet stack[2048];
	octet t[32 * 5];
	// поле и эк
	qr_o* f;
	ec_o* ec;
	// подготовить память
	if (sizeof(state) < f_keep + ec_keep ||
		sizeof(stack) < f_deep ||
		sizeof(t) < 3 * no)
		return FALSE;
	// создать f = GF(p)
	hexToRev(t, p);
	f = (qr_o*)(state + ec_keep);
	if (!gfpCreate(f, t, no, stack))
		return FALSE;
	// создать ec = EC_{ab}(f)
	hexToRev(t, a), hexToRev(t + no, b);
	ec = (ec_o*)state;
	if (sizeof(stack) < ecpCreateJ_deep(n, f_deep) ||
		!ecpCreateJ(ec, f, t, t + no, stack))
		return FALSE;
	// создать группу точек ec
	hexToRev(t, xbase), hexToRev(t + no, ybase), hexToRev(t + 2 * no, q);
	if (sizeof(stack) < ecCreateGroup_deep(f_deep) ||
		!ecCreateGroup(ec, t, t + no, t + 2 * no, no, cofactor, stack))
		return FALSE;
	// присоединить f к ec
	objAppend(ec, f, 0);
	// корректная кривая?
	if (sizeof(stack) < ecpIsValid_deep(n, f_deep) ||
		!ecpIsValid(ec, stack))
		return FALSE;
	// корректная группа?
	if (sizeof(stack) < ecpSeemsValidGroup_deep(n, f_deep) ||
		!ecpSeemsValidGroup(ec, stack))
		return FALSE;
	// надежная группа?
	if (sizeof(stack) < ecpIsSafeGroup_deep(n) ||
		!ecpIsSafeGroup(ec, 40, stack))
		return FALSE;
	// базовая точка имеет порядок q?
	if (sizeof(stack) < ecHasOrderA_deep(n, ec->d, ec->deep, n) ||
		!ecHasOrderA(ec->base, ec, ec->order, n, stack))
		return FALSE;
	// утроить базовую точку разными способами
	if (sizeof(t) < (2 + ec->d) * no ||
		sizeof(stack) < utilMax(5,
			ec->deep,
			ecpIsOnA_deep(n, f_deep),
			ecpAddAA_deep(n, f_deep),
			ecpSubAA_deep(n, f_deep),
			ecMulA_deep(n, ec->d, ec->deep, 1)))
		return FALSE;
	{
		word* pts = (word*)t;
		word d = 3;
		// удвоить и сложить
		if (!ecpIsOnA(ec->base, ec, stack) ||
			!ecpAddAA(pts, ec->base, ec->base, ec, stack) ||
			!ecpAddAA(pts, pts, ec->base, ec, stack))
			return FALSE;
		// дважды удвоить и вычесть
		if (!ecpAddAA(pts + 2 * n, ec->base, ec->base, ec, stack) ||
			!ecpAddAA(pts + 2 * n, pts + 2 * n, pts + 2 * n, ec, stack) ||
			!ecpSubAA(pts + 2 * n, pts + 2 * n, ec->base, ec, stack) ||
			!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
		ecpNegA(pts + 2 * n, pts + 2 * n, ec);
		if (ecpAddAA(pts + 2 * n, pts, pts + 2 * n, ec, stack))
			return FALSE;
		// вычислить кратную точку
		if (!ecMulA(pts + 2 * n, ec->base, ec, &d, 1, stack) ||
			!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
		// утроить напрямую
		if (!ec->froma || !ec->tpl || !ec->toa)
			return FALSE;
		ec->froma(pts + 2 * n, ec->base, ec, stack);
		ec->tpl(pts + 2 * n, pts + 2 * n, ec, stack);
		ec->toa(pts + 2 * n, pts + 2 * n, ec, stack);
		if (!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
	}
	// вывести f = GF(p) за пределы ec
	f = (qr_o*)(state + ec_keep);
	memMove(f, objPtr(ec, 0, qr_o), f_keep);
	// создать ec = EC_{a-1, b}(f)
	hexToRev(t, a), --t[0], hexToRev(t + no, b);
	ec = (ec_o*)state;
	if (sizeof(stack) < ecpCreateJ_deep(n, f_deep) ||
		!ecpCreateJ(ec, f, t, t + no, stack))
		return FALSE;
	// присоединить f к ec
	objAppend(ec, f, 0);
	// точка (xbase = 0, ybase) все еще лежит на ec: ybase^2 = b
	hexToRev(t, xbase), hexToRev(t + no, ybase);
	wwFrom(ec->base, t, no), wwFrom(ec->base + n, t + no, no);
	ASSERT(wwIsZero(ec->base, n));
	// утроить базовую точку разными способами
	if (sizeof(t) < (2 + ec->d) * no ||
		sizeof(stack) < utilMax(5,
			ec->deep,
			ecpIsOnA_deep(n, f_deep),
			ecpAddAA_deep(n, f_deep),
			ecpSubAA_deep(n, f_deep),
			ecMulA_deep(n, ec->d, ec->deep, 1)))
		return FALSE;
	{
		word* pts = (word*)t;
		word d = 3;
		// удвоить и сложить
		if (!ecpIsOnA(ec->base, ec, stack) ||
			!ecpAddAA(pts, ec->base, ec->base, ec, stack) ||
			!ecpAddAA(pts, pts, ec->base, ec, stack))
			return FALSE;
		// дважды удвоить и вычесть
		if (!ecpAddAA(pts + 2 * n, ec->base, ec->base, ec, stack) ||
			!ecpAddAA(pts + 2 * n, pts + 2 * n, pts + 2 * n, ec, stack) ||
			!ecpSubAA(pts + 2 * n, pts + 2 * n, ec->base, ec, stack) ||
			!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
		ecpNegA(pts + 2 * n, pts + 2 * n, ec);
		if (ecpAddAA(pts + 2 * n, pts, pts + 2 * n, ec, stack))
			return FALSE;
		// вычислить кратную точку
		if (!ecMulA(pts + 2 * n, ec->base, ec, &d, 1, stack) ||
			!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
		// утроить напрямую
		if (!ec->froma || !ec->tpl || !ec->toa)
			return FALSE;
		ec->froma(pts + 2 * n, ec->base, ec, stack);
		ec->tpl(pts + 2 * n, pts + 2 * n, ec, stack);
		ec->toa(pts + 2 * n, pts + 2 * n, ec, stack);
		if (!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
	}
	// все нормально
	return TRUE;
}